

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O1

optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t>
* __thiscall
Gudhi::ripser::
Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>
::
Simplex_coboundary_enumerator_<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Tag_dense>
::next_raw(optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t>
           *__return_storage_ptr__,
          Simplex_coboundary_enumerator_<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Tag_dense>
          *this,bool all_cofacets)

{
  long *plVar1;
  simplex_t *psVar2;
  dimension_t *pdVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  int *piVar9;
  undefined8 uVar10;
  ulong uVar11;
  undefined1 _index [16];
  simplex_t sVar12;
  bool bVar13;
  simplex_t *psVar14;
  simplex_t *psVar15;
  logic_error *this_00;
  int *piVar16;
  long in_RCX;
  int extraout_EDX;
  ulong extraout_RDX;
  long extraout_RDX_00;
  long extraout_RDX_01;
  float *pfVar17;
  ulong uVar18;
  float fVar19;
  float fVar20;
  undefined1 in_stack_ffffffffffffffb8 [12];
  undefined8 local_38;
  undefined8 uStack_30;
  
  bVar13 = has_next(this,all_cofacets);
  if (bVar13) {
    while( true ) {
      psVar14 = Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::operator()
                          ((simplex_t *)this->simplex_encoding,
                           (Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_> *)
                           (ulong)(uint)this->j,(int)this->k,(dimension_t)in_RCX);
      uVar8 = *(ulong *)((long)&this->idx_below + 8);
      uVar18 = (ulong)(*(simplex_t **)&this->idx_below < psVar14);
      uVar11 = uVar8 - extraout_RDX;
      in_RCX = uVar11 - uVar18;
      if (uVar8 < extraout_RDX || uVar11 < uVar18) break;
      psVar15 = Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::operator()
                          ((simplex_t *)this->simplex_encoding,
                           (Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_> *)
                           (ulong)(uint)this->j,(int)this->k,(dimension_t)in_RCX);
      psVar14 = *(simplex_t **)&this->idx_below;
      *(long *)&this->idx_below = (long)this->idx_below - (long)psVar15;
      plVar1 = (long *)((long)&this->idx_below + 8);
      *plVar1 = (*plVar1 - extraout_RDX_00) - (ulong)(psVar14 < psVar15);
      psVar14 = Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::operator()
                          ((simplex_t *)this->simplex_encoding,
                           (Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_> *)
                           (ulong)(uint)this->j,(int)(char)(this->k + '\x01'),(dimension_t)in_RCX);
      psVar2 = &this->idx_above;
      sVar12 = *psVar2;
      *(long *)psVar2 = (long)*psVar2 + (long)psVar14;
      plVar1 = (long *)((long)&this->idx_above + 8);
      *plVar1 = *plVar1 + extraout_RDX_01 + (ulong)CARRY8((ulong)sVar12,(ulong)psVar14);
      this->j = this->j + -1;
      pdVar3 = &this->k;
      cVar4 = *pdVar3;
      *pdVar3 = *pdVar3 + -1;
      if (cVar4 == '\0') {
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(this_00,"");
        __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
    }
    fVar19 = (this->simplex).
             super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::entry_with_coeff_t>
             .first;
    piVar16 = (this->vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar9 = (this->vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (piVar16 != piVar9) {
      iVar5 = this->j;
      do {
        iVar6 = *piVar16;
        fVar20 = 0.0;
        if (iVar5 != iVar6) {
          if (iVar5 < iVar6) {
            pfVar17 = (this->dist->rows).super__Vector_base<float_*,_std::allocator<float_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[iVar6] + iVar5;
          }
          else {
            pfVar17 = (this->dist->rows).super__Vector_base<float_*,_std::allocator<float_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[iVar5] + iVar6;
          }
          fVar20 = *pfVar17;
        }
        if (fVar20 <= fVar19) {
          fVar20 = fVar19;
        }
        fVar19 = fVar20;
        piVar16 = piVar16 + 1;
      } while (piVar16 != piVar9);
    }
    uVar8 = (ulong)this->idx_above;
    uVar10 = *(undefined8 *)((long)&this->idx_above + 8);
    uVar7 = this->j;
    this->j = uVar7 - 1;
    psVar14 = Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::operator()
                        ((simplex_t *)this->simplex_encoding,
                         (Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_> *)
                         (ulong)uVar7,(int)(char)(this->k + '\x01'),(dimension_t)piVar9);
    uVar18 = uVar8 + (long)this->idx_below;
    _index._12_4_ = fVar19;
    _index._0_12_ = in_stack_ffffffffffffffb8;
    entry_with_coeff_t::entry_with_coeff_t
              ((entry_with_coeff_t *)&local_38,(simplex_t)_index,(int)uVar18 + (int)psVar14,
               extraout_EDX +
               (int)uVar10 + (int)*(undefined8 *)((long)&this->idx_below + 8) +
               (uint)CARRY8(uVar8,(ulong)this->idx_below) + (uint)CARRY8(uVar18,(ulong)psVar14));
    (__return_storage_ptr__->
    super__Optional_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t,_true,_true>
    )._M_payload.
    super__Optional_payload_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t>
    ._M_payload._M_value.
    super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::entry_with_coeff_t>
    .first = fVar19;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t,_true,_true>
             )._M_payload.
             super__Optional_payload_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t>
             ._M_payload + 0x10) = local_38;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t,_true,_true>
             )._M_payload.
             super__Optional_payload_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t>
             ._M_payload + 0x18) = uStack_30;
    bVar13 = true;
  }
  else {
    bVar13 = false;
  }
  (__return_storage_ptr__->
  super__Optional_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t,_true,_true>
  )._M_payload.
  super__Optional_payload_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t>
  ._M_engaged = bVar13;
  return __return_storage_ptr__;
}

Assistant:

std::optional<diameter_entry_t> next_raw(bool all_cofacets = true) {
      if (!has_next(all_cofacets)) return std::nullopt;
      // this requires simplex_encoding(x,0)>0
      while (simplex_encoding(j, k) <= idx_below) {
        idx_below -= simplex_encoding(j, k);
        idx_above += simplex_encoding(j, k + 1);
        --j;
        --k;
        GUDHI_assert(k != -1);
      }
      value_t cofacet_diameter = get_diameter(simplex);
      // The order of j and i matters for performance
      for (vertex_t i : vertices) cofacet_diameter = std::max(cofacet_diameter, dist(j, i));
      simplex_t cofacet_index = idx_above + simplex_encoding(j--, k + 1) + idx_below;
      coefficient_t cofacet_coefficient = parent.get_coefficient(simplex);
      if (k & 1) cofacet_coefficient = parent.modulus - cofacet_coefficient;
      return parent.make_diameter_entry(cofacet_diameter, cofacet_index, cofacet_coefficient);
    }